

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

void mpr_init_neighbor_graph(neighbor_graph *graph,neighbor_graph_interface *methods)

{
  avl_init(&graph->set_n,avl_comp_netaddr,0);
  avl_init(graph,avl_comp_netaddr,0);
  avl_init(&graph->set_n2,avl_comp_netaddr,0);
  avl_init(&graph->set_mpr,avl_comp_netaddr,0);
  avl_init(&graph->set_mpr_candidates,avl_comp_netaddr,0);
  graph->methods = methods;
  return;
}

Assistant:

void
mpr_init_neighbor_graph(struct neighbor_graph *graph, struct neighbor_graph_interface *methods) {
  avl_init(&graph->set_n, avl_comp_netaddr, false);
  avl_init(&graph->set_n1, avl_comp_netaddr, false);
  avl_init(&graph->set_n2, avl_comp_netaddr, false);
  avl_init(&graph->set_mpr, avl_comp_netaddr, false);
  avl_init(&graph->set_mpr_candidates, avl_comp_netaddr, false);
  graph->methods = methods;
}